

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

double __thiscall uttt::Eval1::operator()(Eval1 *this,IBoard *board)

{
  IPlayer IVar1;
  int iVar2;
  const_reference pvVar3;
  IBoard *in_RSI;
  int i;
  double points;
  int status;
  size_type in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  double local_28;
  double local_8;
  
  iVar2 = IBoard::GetStatus(in_RSI);
  if (iVar2 == 0) {
    local_8 = 0.0;
  }
  else if (iVar2 == -1) {
    local_28 = 0.0;
    for (iVar2 = 0; iVar2 < 9; iVar2 = iVar2 + 1) {
      pvVar3 = std::array<short,_9UL>::operator[]
                         ((array<short,_9UL> *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
      local_28 = g_eval_micro1[*pvVar3] * g_eval_micro_relative[iVar2] + local_28;
    }
    local_8 = (double)(in_RSI->player * -2 + 3) * (g_eval_macro1[in_RSI->macro] + local_28);
  }
  else {
    IVar1 = IBoard::GetPlayerToMove(in_RSI);
    if (IVar1 == iVar2) {
      local_8 = std::numeric_limits<double>::max();
    }
    else {
      local_8 = std::numeric_limits<double>::max();
      local_8 = -local_8;
    }
  }
  return local_8;
}

Assistant:

double
Eval1::operator()(const IBoard &board) const
{
    int status = board.GetStatus();
    if (status == game::Draw)
        return 0.0;
    if (status != game::Undecided)
    {
        if (board.GetPlayerToMove() == status)
            return std::numeric_limits<double>::max();
        return -std::numeric_limits<double>::max();
    }
    double points = 0.0;
    for (int i = 0; i < 9; ++i)
        points += g_eval_micro1[board.micro[i]] * g_eval_micro_relative[i];
    points += g_eval_macro1[board.macro];
    return (-2 * board.player + 3) * points;
}